

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::pushOpStack(VirtualMachine *this,Variable v)

{
  element_type *peVar1;
  string local_50;
  undefined1 local_30 [8];
  Variable v_local;
  
  v_local._0_8_ = v.field_1;
  local_30._0_4_ = v.type;
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::push_back
              (&peVar1->opStack,(value_type *)local_30);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"No active stack frame found to push op stack!",
             (allocator<char> *)((long)&v_local.field_1 + 7));
  panic(this,&local_50);
}

Assistant:

void runtime::VirtualMachine::pushOpStack(Variable v) {
  if (this->stackFrame == nullptr) {
    this->panic("No active stack frame found to push op stack!");
  }

  this->stackFrame->opStack.push_back(v);
}